

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_andnot.c
# Opt level: O0

int run_array_array_subtract(run_container_t *rc,array_container_t *a_in,array_container_t *a_out)

{
  ushort min;
  uint uVar1;
  long in_RDX;
  int *in_RSI;
  int *in_RDI;
  int32_t i_2;
  int32_t i_1;
  uint16_t next_nonincluded;
  int32_t i;
  int32_t end;
  int32_t start;
  int rlepos;
  int32_t in_array_pos;
  int out_card;
  uint local_3c;
  uint local_38;
  ushort local_32;
  uint local_30;
  int local_24;
  int32_t local_20;
  int local_1c;
  
  local_1c = 0;
  local_20 = -1;
  for (local_24 = 0; local_24 < *in_RDI; local_24 = local_24 + 1) {
    min = *(ushort *)(*(long *)(in_RDI + 2) + (long)local_24 * 4);
    local_3c = (uint)min;
    uVar1 = local_3c + *(ushort *)(*(long *)(in_RDI + 2) + 2 + (long)local_24 * 4) + 1;
    local_20 = advanceUntil(*(uint16_t **)(in_RSI + 2),local_20,*in_RSI,min);
    local_30 = local_3c;
    if (local_20 < *in_RSI) {
      local_32 = *(ushort *)(*(long *)(in_RSI + 2) + (long)local_20 * 2);
      local_38 = local_3c;
      if (local_32 < uVar1) {
        for (; (int)local_3c < (int)uVar1; local_3c = local_3c + 1) {
          if (local_3c == local_32) {
            if (local_20 + 1 < *in_RSI) {
              local_20 = local_20 + 1;
              local_32 = *(ushort *)(*(long *)(in_RSI + 2) + (long)local_20 * 2);
            }
            else {
              local_32 = 0;
            }
          }
          else {
            *(short *)(*(long *)(in_RDX + 8) + (long)local_1c * 2) = (short)local_3c;
            local_1c = local_1c + 1;
          }
        }
      }
      else {
        for (; (int)local_38 < (int)uVar1; local_38 = local_38 + 1) {
          *(short *)(*(long *)(in_RDX + 8) + (long)local_1c * 2) = (short)local_38;
          local_1c = local_1c + 1;
        }
      }
      local_20 = local_20 + -1;
    }
    else {
      for (; (int)local_30 < (int)uVar1; local_30 = local_30 + 1) {
        *(short *)(*(long *)(in_RDX + 8) + (long)local_1c * 2) = (short)local_30;
        local_1c = local_1c + 1;
      }
    }
  }
  return local_1c;
}

Assistant:

static int run_array_array_subtract(const run_container_t *rc,
                                    const array_container_t *a_in,
                                    array_container_t *a_out) {
    int out_card = 0;
    int32_t in_array_pos =
        -1;  // since advanceUntil always assumes we start the search AFTER this

    for (int rlepos = 0; rlepos < rc->n_runs; rlepos++) {
        int32_t start = rc->runs[rlepos].value;
        int32_t end = start + rc->runs[rlepos].length + 1;

        in_array_pos = advanceUntil(a_in->array, in_array_pos,
                                    a_in->cardinality, (uint16_t)start);

        if (in_array_pos >= a_in->cardinality) {  // run has no items subtracted
            for (int32_t i = start; i < end; ++i)
                a_out->array[out_card++] = (uint16_t)i;
        } else {
            uint16_t next_nonincluded = a_in->array[in_array_pos];
            if (next_nonincluded >= end) {
                // another case when run goes unaltered
                for (int32_t i = start; i < end; ++i)
                    a_out->array[out_card++] = (uint16_t)i;
                in_array_pos--;  // ensure we see this item again if necessary
            } else {
                for (int32_t i = start; i < end; ++i)
                    if (i != next_nonincluded)
                        a_out->array[out_card++] = (uint16_t)i;
                    else  // 0 should ensure  we don't match
                        next_nonincluded =
                            (in_array_pos + 1 >= a_in->cardinality)
                                ? 0
                                : a_in->array[++in_array_pos];
                in_array_pos--;  // see again
            }
        }
    }
    return out_card;
}